

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBvhTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
btBvhTriangleMeshShape::setOptimizedBvh
          (btBvhTriangleMeshShape *this,btOptimizedBvh *bvh,btVector3 *scaling)

{
  int iVar1;
  undefined4 extraout_var;
  float fVar3;
  float fVar4;
  float fVar5;
  float *pfVar2;
  
  this->m_bvh = bvh;
  this->m_ownsBvh = false;
  iVar1 = (*(this->super_btTriangleMeshShape).super_btConcaveShape.super_btCollisionShape.
            _vptr_btCollisionShape[7])();
  pfVar2 = (float *)CONCAT44(extraout_var,iVar1);
  fVar3 = *pfVar2 - scaling->m_floats[0];
  fVar4 = pfVar2[1] - scaling->m_floats[1];
  fVar5 = pfVar2[2] - scaling->m_floats[2];
  if (1.1920929e-07 < fVar5 * fVar5 + fVar3 * fVar3 + fVar4 * fVar4) {
    btTriangleMeshShape::setLocalScaling(&this->super_btTriangleMeshShape,scaling);
    return;
  }
  return;
}

Assistant:

void   btBvhTriangleMeshShape::setOptimizedBvh(btOptimizedBvh* bvh, const btVector3& scaling)
{
   btAssert(!m_bvh);
   btAssert(!m_ownsBvh);

   m_bvh = bvh;
   m_ownsBvh = false;
   // update the scaling without rebuilding the bvh
   if ((getLocalScaling() -scaling).length2() > SIMD_EPSILON)
   {
      btTriangleMeshShape::setLocalScaling(scaling);
   }
}